

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_sorted.c
# Opt level: O3

void lyds_split(lyd_node **first_sibling,lyd_node *leader,lyd_node *node,lyd_node **next_p)

{
  lyd_node *plVar1;
  lyd_node *node_00;
  lyd_node *plVar2;
  lyd_meta *root_meta;
  rb_node *rbt;
  lyd_node *local_58;
  lyd_meta *local_50;
  lysc_type_bitenum_item *local_48;
  rb_node *local_40;
  lyd_node **local_38;
  
  local_58 = node;
  if ((leader == (lyd_node *)0x0) || (node == (lyd_node *)0x0)) {
    __assert_fail("leader && node",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_sorted.c"
                  ,0x555,
                  "void lyds_split(struct lyd_node **, struct lyd_node *, struct lyd_node *, struct lyd_node **)"
                 );
  }
  local_48 = (lysc_type_bitenum_item *)lyds_get_rb_tree(leader,&local_50);
  node_00 = node->next;
  if (node == leader || local_48 == (lysc_type_bitenum_item *)0x0) {
    lyd_unlink_ignore_lyds(first_sibling,node);
    plVar1 = local_58;
    while (plVar2 = node_00, plVar2 != (lyd_node *)0x0) {
      if (plVar2->schema != local_58->schema) goto LAB_001557e9;
      node_00 = plVar2->next;
      lyd_unlink_ignore_lyds(first_sibling,plVar2);
      lyd_insert_after_node(&local_58,plVar1,plVar2);
      plVar1 = plVar2;
    }
    plVar2 = (lyd_node *)0x0;
LAB_001557e9:
    *next_p = plVar2;
  }
  else {
    if ((node_00 == (lyd_node *)0x0) || (node_00->schema != node->schema)) {
      rb_remove_node(local_50,(rb_node **)&local_48,node,&local_40);
      free(local_40);
      lyd_unlink_ignore_lyds(first_sibling,local_58);
    }
    else {
      local_38 = next_p;
      rb_remove_node(local_50,(rb_node **)&local_48,node,&local_40);
      free(local_40);
      local_40 = (rb_node *)0x0;
      lyd_unlink_ignore_lyds(first_sibling,local_58);
      plVar1 = local_58;
      do {
        next_p = local_38;
        if (node_00->schema != local_58->schema) goto LAB_001558e2;
        plVar2 = node_00->next;
        rb_remove_node(local_50,(rb_node **)&local_48,node_00,&local_40);
        free(local_40);
        local_40 = (rb_node *)0x0;
        lyd_unlink_ignore_lyds(first_sibling,node_00);
        lyd_insert_after_node(&local_58,plVar1,node_00);
        plVar1 = node_00;
        node_00 = plVar2;
      } while (plVar2 != (lyd_node *)0x0);
      node_00 = (lyd_node *)0x0;
      next_p = local_38;
    }
LAB_001558e2:
    *next_p = node_00;
    (local_50->value).field_2.enum_item = local_48;
  }
  return;
}

Assistant:

void
lyds_split(struct lyd_node **first_sibling, struct lyd_node *leader, struct lyd_node *node, struct lyd_node **next_p)
{
    struct rb_node *rbt, *rbn;
    struct lyd_node *iter, *next, *start, *dst;
    struct lyd_meta *root_meta;

    assert(leader && node);

    rbt = lyds_get_rb_tree(leader, &root_meta);
    if (!rbt || (leader == node)) {
        /* Second list is just unlinked */
        start = node->next;
        lyd_unlink_ignore_lyds(first_sibling, node);
        dst = node;
        LY_LIST_FOR_SAFE(start, next, iter) {
            if (iter->schema != node->schema) {
                break;
            }
            lyd_unlink_ignore_lyds(first_sibling, iter);
            lyd_insert_after_node(&node, dst, iter);
            dst = iter;
        }
        *next_p = iter;
        return;
    }

    start = node->next;
    if (!start || (start->schema != node->schema)) {
        /* @p node is the last node, remove from Red-black tree and unlink */
        rb_remove_node(root_meta, &rbt, node, &rbn);
        rb_free_node(&rbn);
        lyd_unlink_ignore_lyds(first_sibling, node);
        *next_p = start;
        goto cleanup;
    }

    /* remove @p node from Red-black tree and unlink */
    rb_remove_node(root_meta, &rbt, node, &rbn);
    rb_free_node(&rbn);
    lyd_unlink_ignore_lyds(first_sibling, node);

    /* remove the rest of nodes from Red-black tree and unlink */
    dst = node;
    LY_LIST_FOR_SAFE(start, next, iter) {
        if (iter->schema != node->schema) {
            break;
        }
        rb_remove_node(root_meta, &rbt, iter, &rbn);
        rb_free_node(&rbn);
        lyd_unlink_ignore_lyds(first_sibling, iter);
        /* insert them to the second (leaf-)list */
        lyd_insert_after_node(&node, dst, iter);
        dst = iter;
    }
    *next_p = iter;

cleanup:
    RBT_SET(root_meta, rbt);
}